

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O3

void Intra16Preds_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  uint8_t *puVar1;
  byte bVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [15];
  unkuint9 Var12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [13];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  int j_1;
  uint uVar17;
  uint uVar18;
  long lVar19;
  uint8_t *puVar20;
  int j;
  undefined4 uVar21;
  __m128i top_values;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  undefined1 uVar24;
  undefined1 uVar25;
  
  if (top == (uint8_t *)0x0) {
    if (left == (uint8_t *)0x0) {
      lVar19 = 0;
      do {
        puVar20 = dst + lVar19;
        puVar20[0] = 0x80;
        puVar20[1] = 0x80;
        puVar20[2] = 0x80;
        puVar20[3] = 0x80;
        puVar20[4] = 0x80;
        puVar20[5] = 0x80;
        puVar20[6] = 0x80;
        puVar20[7] = 0x80;
        puVar20[8] = 0x80;
        puVar20[9] = 0x80;
        puVar20[10] = 0x80;
        puVar20[0xb] = 0x80;
        puVar20[0xc] = 0x80;
        puVar20[0xd] = 0x80;
        puVar20[0xe] = 0x80;
        puVar20[0xf] = 0x80;
        lVar19 = lVar19 + 0x20;
      } while (lVar19 != 0x200);
    }
    else {
      auVar22 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])left);
      uVar17 = auVar22._8_4_ + auVar22._0_4_ + 8;
      uVar18 = uVar17 >> 4;
      bVar2 = (byte)(uVar17 >> 0x18);
      uVar25 = (undefined1)(uVar18 >> 0x10);
      uVar24 = (undefined1)(uVar18 >> 8);
      auVar22._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(bVar2 >> 4,bVar2 >> 4),uVar25),CONCAT14(uVar25,uVar18))
                >> 0x20);
      auVar22[3] = uVar24;
      auVar22[2] = uVar24;
      auVar22[0] = (undefined1)uVar18;
      auVar22[1] = auVar22[0];
      auVar22._8_8_ = 0;
      auVar22 = pshuflw(auVar22,auVar22,0);
      uVar21 = auVar22._0_4_;
      lVar19 = 0;
      do {
        puVar20 = dst + lVar19;
        *(undefined4 *)puVar20 = uVar21;
        *(undefined4 *)(puVar20 + 4) = uVar21;
        *(undefined4 *)(puVar20 + 8) = uVar21;
        *(undefined4 *)(puVar20 + 0xc) = uVar21;
        lVar19 = lVar19 + 0x20;
      } while (lVar19 != 0x200);
    }
  }
  else if (left == (uint8_t *)0x0) {
    auVar22 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])top);
    uVar17 = auVar22._8_4_ + auVar22._0_4_ + 8;
    uVar18 = uVar17 >> 4;
    bVar2 = (byte)(uVar17 >> 0x18);
    uVar25 = (undefined1)(uVar18 >> 0x10);
    uVar24 = (undefined1)(uVar18 >> 8);
    auVar26._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(bVar2 >> 4,bVar2 >> 4),uVar25),CONCAT14(uVar25,uVar18)) >>
              0x20);
    auVar26[3] = uVar24;
    auVar26[2] = uVar24;
    auVar26[0] = (undefined1)uVar18;
    auVar26[1] = auVar26[0];
    auVar26._8_8_ = 0;
    auVar22 = pshuflw(auVar26,auVar26,0);
    uVar21 = auVar22._0_4_;
    lVar19 = 0;
    do {
      puVar20 = dst + lVar19;
      *(undefined4 *)puVar20 = uVar21;
      *(undefined4 *)(puVar20 + 4) = uVar21;
      *(undefined4 *)(puVar20 + 8) = uVar21;
      *(undefined4 *)(puVar20 + 0xc) = uVar21;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0x200);
  }
  else {
    auVar26 = psadbw(*(undefined1 (*) [16])top,(undefined1  [16])0x0);
    auVar22 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])left);
    uVar17 = auVar26._8_4_ + auVar26._0_4_ + auVar22._8_4_ + auVar22._0_4_ + 0x10;
    uVar18 = uVar17 >> 5;
    bVar2 = (byte)(uVar17 >> 0x18);
    uVar25 = (undefined1)(uVar18 >> 0x10);
    uVar24 = (undefined1)(uVar18 >> 8);
    auVar23._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(bVar2 >> 5,bVar2 >> 5),uVar25),CONCAT14(uVar25,uVar18)) >>
              0x20);
    auVar23[3] = uVar24;
    auVar23[2] = uVar24;
    auVar23[0] = (undefined1)uVar18;
    auVar23[1] = auVar23[0];
    auVar23._8_8_ = 0;
    auVar22 = pshuflw(auVar23,auVar23,0);
    uVar21 = auVar22._0_4_;
    lVar19 = 0;
    do {
      puVar20 = dst + lVar19;
      *(undefined4 *)puVar20 = uVar21;
      *(undefined4 *)(puVar20 + 4) = uVar21;
      *(undefined4 *)(puVar20 + 8) = uVar21;
      *(undefined4 *)(puVar20 + 0xc) = uVar21;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0x200);
  }
  if (top == (uint8_t *)0x0) {
    lVar19 = 0;
    do {
      builtin_memcpy(dst + lVar19 + 0x200,
                     "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",0x10);
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0x200);
  }
  else {
    uVar9 = *(undefined8 *)top;
    uVar10 = *(undefined8 *)(top + 8);
    lVar19 = 0;
    do {
      *(undefined8 *)(dst + lVar19 + 0x200) = uVar9;
      *(undefined8 *)(dst + lVar19 + 0x200 + 8) = uVar10;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0x200);
  }
  puVar20 = dst + 0x210;
  lVar19 = 0;
  if (left == (uint8_t *)0x0) {
    do {
      puVar1 = puVar20 + lVar19;
      puVar1[0] = 0x81;
      puVar1[1] = 0x81;
      puVar1[2] = 0x81;
      puVar1[3] = 0x81;
      puVar1[4] = 0x81;
      puVar1[5] = 0x81;
      puVar1[6] = 0x81;
      puVar1[7] = 0x81;
      puVar1[8] = 0x81;
      puVar1[9] = 0x81;
      puVar1[10] = 0x81;
      puVar1[0xb] = 0x81;
      puVar1[0xc] = 0x81;
      puVar1[0xd] = 0x81;
      puVar1[0xe] = 0x81;
      puVar1[0xf] = 0x81;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0x200);
    if (top == (uint8_t *)0x0) {
      lVar19 = 0;
      do {
        puVar20 = dst + lVar19 + 0x10;
        puVar20[0] = 0x81;
        puVar20[1] = 0x81;
        puVar20[2] = 0x81;
        puVar20[3] = 0x81;
        puVar20[4] = 0x81;
        puVar20[5] = 0x81;
        puVar20[6] = 0x81;
        puVar20[7] = 0x81;
        puVar20[8] = 0x81;
        puVar20[9] = 0x81;
        puVar20[10] = 0x81;
        puVar20[0xb] = 0x81;
        puVar20[0xc] = 0x81;
        puVar20[0xd] = 0x81;
        puVar20[0xe] = 0x81;
        puVar20[0xf] = 0x81;
        lVar19 = lVar19 + 0x20;
      } while (lVar19 != 0x200);
    }
    else {
      uVar9 = *(undefined8 *)top;
      uVar10 = *(undefined8 *)(top + 8);
      lVar19 = 0;
      do {
        *(undefined8 *)(dst + lVar19 + 0x10) = uVar9;
        *(undefined8 *)(dst + lVar19 + 0x10 + 8) = uVar10;
        lVar19 = lVar19 + 0x20;
      } while (lVar19 != 0x200);
    }
  }
  else {
    do {
      auVar22 = ZEXT216(CONCAT11(left[lVar19],left[lVar19]));
      auVar22 = pshuflw(auVar22,auVar22,0);
      uVar21 = auVar22._0_4_;
      *(undefined4 *)puVar20 = uVar21;
      *(undefined4 *)(puVar20 + 4) = uVar21;
      *(undefined4 *)(puVar20 + 8) = uVar21;
      *(undefined4 *)(puVar20 + 0xc) = uVar21;
      puVar20 = puVar20 + 0x20;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x10);
    puVar20 = dst + 0x10;
    if (top == (uint8_t *)0x0) {
      lVar19 = 0;
      do {
        auVar22 = ZEXT216(CONCAT11(left[lVar19],left[lVar19]));
        auVar22 = pshuflw(auVar22,auVar22,0);
        uVar21 = auVar22._0_4_;
        *(undefined4 *)puVar20 = uVar21;
        *(undefined4 *)(puVar20 + 4) = uVar21;
        *(undefined4 *)(puVar20 + 8) = uVar21;
        *(undefined4 *)(puVar20 + 0xc) = uVar21;
        puVar20 = puVar20 + 0x20;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
    }
    else {
      auVar22 = *(undefined1 (*) [16])top;
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar22._0_13_;
      auVar3[0xe] = auVar22[7];
      auVar4[0xc] = auVar22[6];
      auVar4._0_12_ = auVar22._0_12_;
      auVar4._13_2_ = auVar3._13_2_;
      auVar5[0xb] = 0;
      auVar5._0_11_ = auVar22._0_11_;
      auVar5._12_3_ = auVar4._12_3_;
      auVar6[10] = auVar22[5];
      auVar6._0_10_ = auVar22._0_10_;
      auVar6._11_4_ = auVar5._11_4_;
      auVar7[9] = 0;
      auVar7._0_9_ = auVar22._0_9_;
      auVar7._10_5_ = auVar6._10_5_;
      auVar8[8] = auVar22[4];
      auVar8._0_8_ = auVar22._0_8_;
      auVar8._9_6_ = auVar7._9_6_;
      auVar11._7_8_ = 0;
      auVar11._0_7_ = auVar8._8_7_;
      Var12 = CONCAT81(SUB158(auVar11 << 0x40,7),auVar22[3]);
      auVar15._9_6_ = 0;
      auVar15._0_9_ = Var12;
      auVar13._1_10_ = SUB1510(auVar15 << 0x30,5);
      auVar13[0] = auVar22[2];
      auVar16._11_4_ = 0;
      auVar16._0_11_ = auVar13;
      auVar14._1_12_ = SUB1512(auVar16 << 0x20,3);
      auVar14[0] = auVar22[1];
      bVar2 = left[-1];
      lVar19 = 0;
      do {
        auVar26 = pshuflw(ZEXT416((uint)left[lVar19] - (uint)bVar2),
                          ZEXT416((uint)left[lVar19] - (uint)bVar2),0);
        sVar33 = auVar26._0_2_;
        sVar35 = sVar33 + (ushort)auVar22[0];
        sVar34 = auVar26._2_2_;
        sVar36 = sVar34 + auVar14._0_2_;
        sVar37 = sVar33 + auVar13._0_2_;
        sVar38 = sVar34 + (short)Var12;
        sVar39 = sVar33 + auVar8._8_2_;
        sVar40 = sVar34 + auVar6._10_2_;
        sVar41 = sVar33 + auVar4._12_2_;
        sVar42 = sVar34 + (auVar3._13_2_ >> 8);
        sVar27 = sVar33 + (ushort)auVar22[8];
        sVar28 = sVar34 + (ushort)auVar22[9];
        sVar29 = sVar33 + (ushort)auVar22[10];
        sVar30 = sVar34 + (ushort)auVar22[0xb];
        sVar31 = sVar33 + (ushort)auVar22[0xc];
        sVar32 = sVar34 + (ushort)auVar22[0xd];
        sVar33 = sVar33 + (ushort)auVar22[0xe];
        sVar34 = sVar34 + (ushort)auVar22[0xf];
        *puVar20 = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
        puVar20[1] = (0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36);
        puVar20[2] = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
        puVar20[3] = (0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38);
        puVar20[4] = (0 < sVar39) * (sVar39 < 0x100) * (char)sVar39 - (0xff < sVar39);
        puVar20[5] = (0 < sVar40) * (sVar40 < 0x100) * (char)sVar40 - (0xff < sVar40);
        puVar20[6] = (0 < sVar41) * (sVar41 < 0x100) * (char)sVar41 - (0xff < sVar41);
        puVar20[7] = (0 < sVar42) * (sVar42 < 0x100) * (char)sVar42 - (0xff < sVar42);
        puVar20[8] = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
        puVar20[9] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
        puVar20[10] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
        puVar20[0xb] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
        puVar20[0xc] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
        puVar20[0xd] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
        puVar20[0xe] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        puVar20[0xf] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
        lVar19 = lVar19 + 1;
        puVar20 = puVar20 + 0x20;
      } while (lVar19 != 0x10);
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void DC16Mode_SSE2(uint8_t* WEBP_RESTRICT dst,
                                      const uint8_t* WEBP_RESTRICT left,
                                      const uint8_t* WEBP_RESTRICT top) {
  if (top != NULL) {
    if (left != NULL) {  // top and left present
      DC16_SSE2(dst, left, top);
    } else {  // top, but no left
      DC16NoLeft_SSE2(dst, top);
    }
  } else if (left != NULL) {  // left but no top
    DC16NoTop_SSE2(dst, left);
  } else {  // no top, no left, nothing.
    DC16NoTopLeft_SSE2(dst);
  }
}